

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O2

void __thiscall
acto::core::message_container<msg_out,false>::message_container<char_const(&)[11]>
          (message_container<msg_out,false> *this,char (*args) [11])

{
  allocator<char> local_31;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  undefined8 uStack_18;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,*args,&local_31);
  *(message_container<msg_out,false> **)this = this + 0x10;
  if (local_30 == &local_20) {
    *(ulong *)(this + 0x10) = CONCAT71(uStack_1f,local_20);
    *(undefined8 *)(this + 0x18) = uStack_18;
  }
  else {
    *(undefined1 **)this = local_30;
    *(ulong *)(this + 0x10) = CONCAT71(uStack_1f,local_20);
  }
  *(undefined8 *)(this + 8) = local_28;
  local_28 = 0;
  local_20 = 0;
  local_30 = &local_20;
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

constexpr message_container(Args&&... args) noexcept(
    std::is_nothrow_constructible_v<T, Args...>)
    : value_(std::forward<Args>(args)...) {
  }